

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O0

ulint __thiscall bwtil::PartialSums::getCounterNumber(PartialSums *this,ulint n,uint i)

{
  ulint MASK;
  uint i_local;
  ulint n_local;
  PartialSums *this_local;
  
  return n >> (((this->d - (char)i) + -1) * this->log2n & 0x3f) & (1L << (this->log2n & 0x3f)) - 1U;
}

Assistant:

inline ulint getCounterNumber(ulint n, uint i){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): getCounterNumber() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(i>=d){
			cout << "ERROR (PartialSums): get counter i>=d (" << i << ">=" << d << ")\n";
			exit(0);
		}
	#endif

		ulint MASK = (((ulint)1)<<log2n)-1;

		return (n>>((d-i-1)*log2n))&MASK;

	}